

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O0

bool anon_unknown.dwarf_49af03::ConditionHelper
               (unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  pointer pCVar2;
  Value *pVVar3;
  type out_00;
  type out_01;
  type out_02;
  type out_03;
  pointer pAVar4;
  type out_04;
  type out_05;
  bool _result_5;
  __single_object c_6;
  bool _result_4;
  __single_object c_5;
  unique_ptr<cmCMakePresetsGraphInternal::NotCondition,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
  local_d0;
  undefined1 local_c1;
  bool _result_3;
  __single_object c_4;
  unique_ptr<cmCMakePresetsGraphInternal::NotCondition,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
  local_b0;
  undefined1 local_a1;
  bool _result_2;
  __single_object c_3;
  unique_ptr<cmCMakePresetsGraphInternal::NotCondition,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
  local_90;
  undefined1 local_81;
  bool _result_1;
  __single_object c_2;
  bool _result;
  __single_object c_1;
  String type;
  unique_ptr<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
  local_30;
  __single_object c;
  cmJSONState *state_local;
  Value *value_local;
  unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
  *out_local;
  
  c._M_t.
  super___uniq_ptr_impl<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
  .super__Head_base<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>,_true,_true>
        )(__uniq_ptr_data<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>,_true,_true>
          )state;
  if (value == (Value *)0x0) {
    std::
    unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
    ::reset(out,(pointer)0x0);
    out_local._7_1_ = 1;
  }
  else {
    bVar1 = Json::Value::isBool(value);
    if (bVar1) {
      std::make_unique<cmCMakePresetsGraphInternal::ConstCondition>();
      bVar1 = Json::Value::asBool(value);
      pCVar2 = std::
               unique_ptr<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
               ::operator->(&local_30);
      pCVar2->Value = bVar1;
      std::
      unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
      ::operator=((unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                   *)out,&local_30);
      out_local._7_1_ = 1;
      std::
      unique_ptr<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
      ::~unique_ptr(&local_30);
    }
    else {
      bVar1 = Json::Value::isNull(value);
      if (bVar1) {
        std::make_unique<cmCMakePresetsGraphInternal::NullCondition>();
        std::
        unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
        ::operator=((unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                     *)out,(unique_ptr<cmCMakePresetsGraphInternal::NullCondition,_std::default_delete<cmCMakePresetsGraphInternal::NullCondition>_>
                            *)((long)&type.field_2 + 8));
        std::
        unique_ptr<cmCMakePresetsGraphInternal::NullCondition,_std::default_delete<cmCMakePresetsGraphInternal::NullCondition>_>
        ::~unique_ptr((unique_ptr<cmCMakePresetsGraphInternal::NullCondition,_std::default_delete<cmCMakePresetsGraphInternal::NullCondition>_>
                       *)((long)&type.field_2 + 8));
        out_local._7_1_ = 1;
      }
      else {
        bVar1 = Json::Value::isObject(value);
        if (bVar1) {
          bVar1 = Json::Value::isMember(value,"type");
          if (!bVar1) {
            cmCMakePresetsErrors::INVALID_CONDITION
                      (value,(cmJSONState *)
                             c._M_t.
                             super___uniq_ptr_impl<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                             .
                             super__Head_base<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_false>
                             ._M_head_impl);
            out_local._7_1_ = 0;
            goto LAB_00354910;
          }
          pVVar3 = Json::Value::operator[](value,"type");
          bVar1 = Json::Value::isString(pVVar3);
          if (!bVar1) {
            cmCMakePresetsErrors::INVALID_CONDITION
                      (value,(cmJSONState *)
                             c._M_t.
                             super___uniq_ptr_impl<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                             .
                             super__Head_base<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_false>
                             ._M_head_impl);
            out_local._7_1_ = 0;
            goto LAB_00354910;
          }
          pVVar3 = Json::Value::operator[](value,"type");
          Json::Value::asString_abi_cxx11_((String *)&c_1,pVVar3);
          bVar1 = std::operator==((String *)&c_1,"const");
          if (bVar1) {
            std::make_unique<cmCMakePresetsGraphInternal::ConstCondition>();
            out_00 = std::
                     unique_ptr<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                     ::operator*((unique_ptr<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                  *)&stack0xffffffffffffff90);
            c_2._M_t.
            super___uniq_ptr_impl<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
            .super__Head_base<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_false>.
            _M_head_impl._7_1_ =
                 cmJSONHelperBuilder::Object<cmCMakePresetsGraphInternal::ConstCondition>::
                 operator()((Object<cmCMakePresetsGraphInternal::ConstCondition> *)
                            (anonymous_namespace)::ConstConditionHelper,out_00,value,
                            (cmJSONState *)
                            c._M_t.
                            super___uniq_ptr_impl<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                            .
                            super__Head_base<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_false>
                            ._M_head_impl);
            out_local._7_1_ =
                 c_2._M_t.
                 super___uniq_ptr_impl<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                 .super__Head_base<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_false>.
                 _M_head_impl._7_1_;
            if ((bool)c_2._M_t.
                      super___uniq_ptr_impl<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                      .super__Head_base<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_false>.
                      _M_head_impl._7_1_) {
              std::
              unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
              ::operator=((unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                           *)out,(unique_ptr<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                  *)&stack0xffffffffffffff90);
              out_local._7_1_ = true;
            }
            c_2._M_t.
            super___uniq_ptr_impl<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
            .super__Head_base<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_false>.
            _M_head_impl._0_4_ = 1;
            std::
            unique_ptr<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
            ::~unique_ptr((unique_ptr<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                           *)&stack0xffffffffffffff90);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&c_1,"equals");
            if ((bVar1) ||
               (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&c_1,"notEquals"), bVar1)) {
              std::make_unique<cmCMakePresetsGraphInternal::EqualsCondition>();
              out_01 = std::
                       unique_ptr<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                       ::operator*((unique_ptr<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                                    *)&stack0xffffffffffffff80);
              local_81 = cmJSONHelperBuilder::Object<cmCMakePresetsGraphInternal::EqualsCondition>::
                         operator()((Object<cmCMakePresetsGraphInternal::EqualsCondition> *)
                                    (anonymous_namespace)::EqualsConditionHelper,out_01,value,
                                    (cmJSONState *)
                                    c._M_t.
                                    super___uniq_ptr_impl<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                    .
                                    super__Head_base<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_false>
                                    ._M_head_impl);
              out_local._7_1_ = local_81;
              if ((bool)local_81) {
                std::
                unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                ::operator=((unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                             *)out,(unique_ptr<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                                    *)&stack0xffffffffffffff80);
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&c_1,"notEquals");
                if (bVar1) {
                  std::
                  unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                  ::unique_ptr((unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                                *)&c_3,out);
                  InvertCondition((anon_unknown_dwarf_49af03 *)&local_90,
                                  (unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                                   *)&c_3);
                  std::
                  unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                  ::operator=((unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                               *)out,&local_90);
                  std::
                  unique_ptr<cmCMakePresetsGraphInternal::NotCondition,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
                  ::~unique_ptr(&local_90);
                  std::
                  unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                  ::~unique_ptr((unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                                 *)&c_3);
                }
                out_local._7_1_ = true;
              }
              c_2._M_t.
              super___uniq_ptr_impl<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
              ._M_t.
              super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
              .super__Head_base<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_false>.
              _M_head_impl._0_4_ = 1;
              std::
              unique_ptr<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
              ::~unique_ptr((unique_ptr<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                             *)&stack0xffffffffffffff80);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&c_1,"inList");
              if ((bVar1) ||
                 (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&c_1,"notInList"), bVar1)) {
                std::make_unique<cmCMakePresetsGraphInternal::InListCondition>();
                out_02 = std::
                         unique_ptr<cmCMakePresetsGraphInternal::InListCondition,_std::default_delete<cmCMakePresetsGraphInternal::InListCondition>_>
                         ::operator*((unique_ptr<cmCMakePresetsGraphInternal::InListCondition,_std::default_delete<cmCMakePresetsGraphInternal::InListCondition>_>
                                      *)&stack0xffffffffffffff60);
                local_a1 = cmJSONHelperBuilder::Object<cmCMakePresetsGraphInternal::InListCondition>
                           ::operator()((Object<cmCMakePresetsGraphInternal::InListCondition> *)
                                        (anonymous_namespace)::InListConditionHelper,out_02,value,
                                        (cmJSONState *)
                                        c._M_t.
                                        super___uniq_ptr_impl<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                        .
                                        super__Head_base<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_false>
                                        ._M_head_impl);
                out_local._7_1_ = local_a1;
                if ((bool)local_a1) {
                  std::
                  unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                  ::operator=((unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                               *)out,(unique_ptr<cmCMakePresetsGraphInternal::InListCondition,_std::default_delete<cmCMakePresetsGraphInternal::InListCondition>_>
                                      *)&stack0xffffffffffffff60);
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&c_1,"notInList");
                  if (bVar1) {
                    std::
                    unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                    ::unique_ptr((unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                                  *)&c_4,out);
                    InvertCondition((anon_unknown_dwarf_49af03 *)&local_b0,
                                    (unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                                     *)&c_4);
                    std::
                    unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                    ::operator=((unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                                 *)out,&local_b0);
                    std::
                    unique_ptr<cmCMakePresetsGraphInternal::NotCondition,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
                    ::~unique_ptr(&local_b0);
                    std::
                    unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                    ::~unique_ptr((unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                                   *)&c_4);
                  }
                  out_local._7_1_ = true;
                }
                c_2._M_t.
                super___uniq_ptr_impl<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                .super__Head_base<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_false>.
                _M_head_impl._0_4_ = 1;
                std::
                unique_ptr<cmCMakePresetsGraphInternal::InListCondition,_std::default_delete<cmCMakePresetsGraphInternal::InListCondition>_>
                ::~unique_ptr((unique_ptr<cmCMakePresetsGraphInternal::InListCondition,_std::default_delete<cmCMakePresetsGraphInternal::InListCondition>_>
                               *)&stack0xffffffffffffff60);
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&c_1,"matches");
                if ((bVar1) ||
                   (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&c_1,"notMatches"), bVar1)) {
                  std::make_unique<cmCMakePresetsGraphInternal::MatchesCondition>();
                  out_03 = std::
                           unique_ptr<cmCMakePresetsGraphInternal::MatchesCondition,_std::default_delete<cmCMakePresetsGraphInternal::MatchesCondition>_>
                           ::operator*((unique_ptr<cmCMakePresetsGraphInternal::MatchesCondition,_std::default_delete<cmCMakePresetsGraphInternal::MatchesCondition>_>
                                        *)&stack0xffffffffffffff40);
                  local_c1 = cmJSONHelperBuilder::
                             Object<cmCMakePresetsGraphInternal::MatchesCondition>::operator()
                                       ((Object<cmCMakePresetsGraphInternal::MatchesCondition> *)
                                        (anonymous_namespace)::MatchesConditionHelper,out_03,value,
                                        (cmJSONState *)
                                        c._M_t.
                                        super___uniq_ptr_impl<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                        .
                                        super__Head_base<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_false>
                                        ._M_head_impl);
                  out_local._7_1_ = local_c1;
                  if ((bool)local_c1) {
                    std::
                    unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                    ::operator=((unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                                 *)out,(unique_ptr<cmCMakePresetsGraphInternal::MatchesCondition,_std::default_delete<cmCMakePresetsGraphInternal::MatchesCondition>_>
                                        *)&stack0xffffffffffffff40);
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&c_1,"notMatches");
                    if (bVar1) {
                      std::
                      unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                      ::unique_ptr((unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                                    *)&c_5,out);
                      InvertCondition((anon_unknown_dwarf_49af03 *)&local_d0,
                                      (unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                                       *)&c_5);
                      std::
                      unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                      ::operator=((unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                                   *)out,&local_d0);
                      std::
                      unique_ptr<cmCMakePresetsGraphInternal::NotCondition,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
                      ::~unique_ptr(&local_d0);
                      std::
                      unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                      ::~unique_ptr((unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                                     *)&c_5);
                    }
                    out_local._7_1_ = true;
                  }
                  c_2._M_t.
                  super___uniq_ptr_impl<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                  .super__Head_base<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_false>.
                  _M_head_impl._0_4_ = 1;
                  std::
                  unique_ptr<cmCMakePresetsGraphInternal::MatchesCondition,_std::default_delete<cmCMakePresetsGraphInternal::MatchesCondition>_>
                  ::~unique_ptr((unique_ptr<cmCMakePresetsGraphInternal::MatchesCondition,_std::default_delete<cmCMakePresetsGraphInternal::MatchesCondition>_>
                                 *)&stack0xffffffffffffff40);
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&c_1,"anyOf");
                  if ((bVar1) ||
                     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&c_1,"allOf"), bVar1)) {
                    std::make_unique<cmCMakePresetsGraphInternal::AnyAllOfCondition>();
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&c_1,"anyOf");
                    pAVar4 = std::
                             unique_ptr<cmCMakePresetsGraphInternal::AnyAllOfCondition,_std::default_delete<cmCMakePresetsGraphInternal::AnyAllOfCondition>_>
                             ::operator->((unique_ptr<cmCMakePresetsGraphInternal::AnyAllOfCondition,_std::default_delete<cmCMakePresetsGraphInternal::AnyAllOfCondition>_>
                                           *)&stack0xffffffffffffff20);
                    pAVar4->StopValue = bVar1;
                    out_04 = std::
                             unique_ptr<cmCMakePresetsGraphInternal::AnyAllOfCondition,_std::default_delete<cmCMakePresetsGraphInternal::AnyAllOfCondition>_>
                             ::operator*((unique_ptr<cmCMakePresetsGraphInternal::AnyAllOfCondition,_std::default_delete<cmCMakePresetsGraphInternal::AnyAllOfCondition>_>
                                          *)&stack0xffffffffffffff20);
                    c_6._M_t.
                    super___uniq_ptr_impl<cmCMakePresetsGraphInternal::NotCondition,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::NotCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
                    .super__Head_base<0UL,_cmCMakePresetsGraphInternal::NotCondition_*,_false>.
                    _M_head_impl._7_1_ =
                         cmJSONHelperBuilder::Object<cmCMakePresetsGraphInternal::AnyAllOfCondition>
                         ::operator()((Object<cmCMakePresetsGraphInternal::AnyAllOfCondition> *)
                                      (anonymous_namespace)::AnyAllOfConditionHelper,out_04,value,
                                      (cmJSONState *)
                                      c._M_t.
                                      super___uniq_ptr_impl<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                      .
                                      super__Head_base<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_false>
                                      ._M_head_impl);
                    out_local._7_1_ =
                         c_6._M_t.
                         super___uniq_ptr_impl<cmCMakePresetsGraphInternal::NotCondition,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::NotCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
                         .super__Head_base<0UL,_cmCMakePresetsGraphInternal::NotCondition_*,_false>.
                         _M_head_impl._7_1_;
                    if ((bool)c_6._M_t.
                              super___uniq_ptr_impl<cmCMakePresetsGraphInternal::NotCondition,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::NotCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
                              .
                              super__Head_base<0UL,_cmCMakePresetsGraphInternal::NotCondition_*,_false>
                              ._M_head_impl._7_1_) {
                      std::
                      unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                      ::operator=((unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                                   *)out,(unique_ptr<cmCMakePresetsGraphInternal::AnyAllOfCondition,_std::default_delete<cmCMakePresetsGraphInternal::AnyAllOfCondition>_>
                                          *)&stack0xffffffffffffff20);
                      out_local._7_1_ = true;
                    }
                    c_2._M_t.
                    super___uniq_ptr_impl<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                    .super__Head_base<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_false>.
                    _M_head_impl._0_4_ = 1;
                    std::
                    unique_ptr<cmCMakePresetsGraphInternal::AnyAllOfCondition,_std::default_delete<cmCMakePresetsGraphInternal::AnyAllOfCondition>_>
                    ::~unique_ptr((unique_ptr<cmCMakePresetsGraphInternal::AnyAllOfCondition,_std::default_delete<cmCMakePresetsGraphInternal::AnyAllOfCondition>_>
                                   *)&stack0xffffffffffffff20);
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&c_1,"not");
                    if (bVar1) {
                      std::make_unique<cmCMakePresetsGraphInternal::NotCondition>();
                      out_05 = std::
                               unique_ptr<cmCMakePresetsGraphInternal::NotCondition,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
                               ::operator*((unique_ptr<cmCMakePresetsGraphInternal::NotCondition,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
                                            *)&stack0xffffffffffffff10);
                      out_local._7_1_ =
                           cmJSONHelperBuilder::Object<cmCMakePresetsGraphInternal::NotCondition>::
                           operator()((Object<cmCMakePresetsGraphInternal::NotCondition> *)
                                      (anonymous_namespace)::NotConditionHelper,out_05,value,
                                      (cmJSONState *)
                                      c._M_t.
                                      super___uniq_ptr_impl<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                                      .
                                      super__Head_base<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_false>
                                      ._M_head_impl);
                      if ((bool)out_local._7_1_) {
                        std::
                        unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                        ::operator=((unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
                                     *)out,(unique_ptr<cmCMakePresetsGraphInternal::NotCondition,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
                                            *)&stack0xffffffffffffff10);
                        out_local._7_1_ = true;
                      }
                      c_2._M_t.
                      super___uniq_ptr_impl<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                      .super__Head_base<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_false>.
                      _M_head_impl._0_4_ = 1;
                      std::
                      unique_ptr<cmCMakePresetsGraphInternal::NotCondition,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
                      ::~unique_ptr((unique_ptr<cmCMakePresetsGraphInternal::NotCondition,_std::default_delete<cmCMakePresetsGraphInternal::NotCondition>_>
                                     *)&stack0xffffffffffffff10);
                    }
                    else {
                      c_2._M_t.
                      super___uniq_ptr_impl<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                      .super__Head_base<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_false>.
                      _M_head_impl._0_4_ = 0;
                    }
                  }
                }
              }
            }
          }
          std::__cxx11::string::~string((string *)&c_1);
          if ((int)c_2._M_t.
                   super___uniq_ptr_impl<cmCMakePresetsGraphInternal::EqualsCondition,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::EqualsCondition>_>
                   .super__Head_base<0UL,_cmCMakePresetsGraphInternal::EqualsCondition_*,_false>.
                   _M_head_impl != 0) goto LAB_00354910;
        }
        cmCMakePresetsErrors::INVALID_CONDITION
                  (value,(cmJSONState *)
                         c._M_t.
                         super___uniq_ptr_impl<cmCMakePresetsGraphInternal::ConstCondition,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_std::default_delete<cmCMakePresetsGraphInternal::ConstCondition>_>
                         .
                         super__Head_base<0UL,_cmCMakePresetsGraphInternal::ConstCondition_*,_false>
                         ._M_head_impl);
        out_local._7_1_ = 0;
      }
    }
  }
LAB_00354910:
  return (bool)(out_local._7_1_ & 1);
}

Assistant:

bool ConditionHelper(std::unique_ptr<cmCMakePresetsGraph::Condition>& out,
                     const Json::Value* value, cmJSONState* state)
{
  if (!value) {
    out.reset();
    return true;
  }

  if (value->isBool()) {
    auto c = cm::make_unique<cmCMakePresetsGraphInternal::ConstCondition>();
    c->Value = value->asBool();
    out = std::move(c);
    return true;
  }

  if (value->isNull()) {
    out = cm::make_unique<cmCMakePresetsGraphInternal::NullCondition>();
    return true;
  }

  if (value->isObject()) {
    if (!value->isMember("type")) {
      cmCMakePresetsErrors::INVALID_CONDITION(value, state);
      return false;
    }

    if (!(*value)["type"].isString()) {
      cmCMakePresetsErrors::INVALID_CONDITION(value, state);
      return false;
    }
    auto type = (*value)["type"].asString();

    if (type == "const") {
      auto c = cm::make_unique<cmCMakePresetsGraphInternal::ConstCondition>();
      CHECK_OK(ConstConditionHelper(*c, value, state));
      out = std::move(c);
      return true;
    }

    if (type == "equals" || type == "notEquals") {
      auto c = cm::make_unique<cmCMakePresetsGraphInternal::EqualsCondition>();
      CHECK_OK(EqualsConditionHelper(*c, value, state));
      out = std::move(c);
      if (type == "notEquals") {
        out = InvertCondition(std::move(out));
      }
      return true;
    }

    if (type == "inList" || type == "notInList") {
      auto c = cm::make_unique<cmCMakePresetsGraphInternal::InListCondition>();
      CHECK_OK(InListConditionHelper(*c, value, state));
      out = std::move(c);
      if (type == "notInList") {
        out = InvertCondition(std::move(out));
      }
      return true;
    }

    if (type == "matches" || type == "notMatches") {
      auto c =
        cm::make_unique<cmCMakePresetsGraphInternal::MatchesCondition>();
      CHECK_OK(MatchesConditionHelper(*c, value, state));
      out = std::move(c);
      if (type == "notMatches") {
        out = InvertCondition(std::move(out));
      }
      return true;
    }

    if (type == "anyOf" || type == "allOf") {
      auto c =
        cm::make_unique<cmCMakePresetsGraphInternal::AnyAllOfCondition>();
      c->StopValue = (type == "anyOf");
      CHECK_OK(AnyAllOfConditionHelper(*c, value, state));
      out = std::move(c);
      return true;
    }

    if (type == "not") {
      auto c = cm::make_unique<cmCMakePresetsGraphInternal::NotCondition>();
      CHECK_OK(NotConditionHelper(*c, value, state));
      out = std::move(c);
      return true;
    }
  }

  cmCMakePresetsErrors::INVALID_CONDITION(value, state);
  return false;
}